

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

void __thiscall dxil_spv::Converter::Impl::mark_used_value(Impl *this,Value *value)

{
  bool bVar1;
  ValueKind kind;
  Value *this_00;
  __hashtable *__h;
  __node_gen_type __node_gen;
  Value *local_18;
  UnorderedSet<const_LLVMBC::Value_*> *local_10;
  
  local_18 = value;
  this_00 = LLVMBC::Internal::resolve_proxy(value);
  kind = LLVMBC::Value::get_value_kind(this_00);
  bVar1 = LLVMBC::Constant::is_base_of_value_kind(kind);
  if (!bVar1) {
    local_10 = &this->llvm_used_ssa_values;
    std::
    _Hashtable<LLVMBC::Value_const*,LLVMBC::Value_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value_const*>,std::__detail::_Identity,std::equal_to<LLVMBC::Value_const*>,std::hash<LLVMBC::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<LLVMBC::Value_const*const&,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<LLVMBC::Value_const*,false>>>>
              ((_Hashtable<LLVMBC::Value_const*,LLVMBC::Value_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value_const*>,std::__detail::_Identity,std::equal_to<LLVMBC::Value_const*>,std::hash<LLVMBC::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_10,&local_18);
  }
  return;
}

Assistant:

void Converter::Impl::mark_used_value(const llvm::Value *value)
{
	if (!llvm::isa<llvm::Constant>(value))
	{
		// Technically, we won't be able to eliminate a chain of SSA expressions
		// which are unused this way, but eeeeeeh. DXC really should handle that.
		// This is to deal with odd-ball edge cases where random single SSA instructions
		// were not eliminated for whatever reason.
		llvm_used_ssa_values.insert(value);
	}
}